

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

int32_t al_fread32le(ALLEGRO_FILE *f)

{
  int32_t iVar1;
  undefined8 in_RAX;
  size_t sVar2;
  uchar b [4];
  int32_t local_4;
  
  local_4 = (int32_t)((ulong)in_RAX >> 0x20);
  sVar2 = al_fread(f,&local_4,4);
  iVar1 = -1;
  if (sVar2 == 4) {
    iVar1 = local_4;
  }
  return iVar1;
}

Assistant:

int32_t al_fread32le(ALLEGRO_FILE *f)
{
   unsigned char b[4];
   ASSERT(f);

   if (al_fread(f, b, 4) == 4) {
      return (((int32_t)b[3] << 24) | ((int32_t)b[2] << 16) |
              ((int32_t)b[1] << 8) | (int32_t)b[0]);
   }

   return EOF;
}